

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = (voice->effects).count;
  if (uVar1 != 0) {
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      (**(code **)(*(long *)((long)&((voice->effects).desc)->pEffect + lVar2) + 0x40))();
      (**(code **)(*(long *)((long)&((voice->effects).desc)->pEffect + lVar2) + 8))();
      uVar1 = (voice->effects).count;
      lVar2 = lVar2 + 0x10;
    }
    (*voice->audio->pFree)((voice->effects).desc);
    (*voice->audio->pFree)((voice->effects).parameters);
    (*voice->audio->pFree)((voice->effects).parameterSizes);
    (*voice->audio->pFree)((voice->effects).parameterUpdates);
    (*voice->audio->pFree)((voice->effects).inPlaceProcessing);
    return;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)
{
	uint32_t i;

	LOG_FUNC_ENTER(voice->audio)
	if (voice->effects.count == 0)
	{
		LOG_FUNC_EXIT(voice->audio)
		return;
	}

	for (i = 0; i < voice->effects.count; i += 1)
	{
		voice->effects.desc[i].pEffect->UnlockForProcess(voice->effects.desc[i].pEffect);
		voice->effects.desc[i].pEffect->Release(voice->effects.desc[i].pEffect);
	}

	voice->audio->pFree(voice->effects.desc);
	voice->audio->pFree(voice->effects.parameters);
	voice->audio->pFree(voice->effects.parameterSizes);
	voice->audio->pFree(voice->effects.parameterUpdates);
	voice->audio->pFree(voice->effects.inPlaceProcessing);
	LOG_FUNC_EXIT(voice->audio)
}